

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<duckdb::date_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *state,date_t *x,string_t *y,
               AggregateBinaryInput *binary)

{
  string_t y_data;
  bool bVar1;
  string_t *in_RDX;
  TemplatedValidityMask<unsigned_long> *in_RSI;
  byte *in_RDI;
  AggregateBinaryInput *in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  date_t *in_stack_ffffffffffffffc8;
  ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *in_stack_ffffffffffffffd0;
  
  if ((*in_RDI & 1) == 0) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffffb8,(idx_t)in_stack_ffffffffffffffb0);
    if (bVar1) {
      TemplatedValidityMask<unsigned_long>::RowIsValid(in_RSI,(idx_t)in_RDI);
      Assign<duckdb::date_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_RDX,
                 SUB81((ulong)in_RSI >> 0x38,0));
      *in_RDI = 1;
    }
  }
  else {
    y_data.value.pointer.ptr = (char *)*(undefined8 *)&in_RDX->value;
    y_data.value._0_8_ = in_stack_ffffffffffffffc0;
    Execute<duckdb::date_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>>
              ((ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *)in_stack_ffffffffffffffb8,
               (date_t)(int32_t)((ulong)*(undefined8 *)((long)&in_RDX->value + 8) >> 0x20),y_data,
               in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}